

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_ext_substm_index(lys_ext_instance_complex *ext,LY_STMT stmt,yytokentype keyword)

{
  long *plVar1;
  lyext_substmt *local_40;
  lyext_substmt *info;
  char ***p;
  char **str;
  int decrement;
  int c;
  yytokentype keyword_local;
  LY_STMT stmt_local;
  lys_ext_instance_complex *ext_local;
  
  str._4_4_ = 0;
  str._0_4_ = 0;
  info = (lyext_substmt *)0x0;
  if ((keyword == BELONGS_TO_KEYWORD) || (stmt == LY_STMT_BELONGSTO)) {
    c = 3;
    str._0_4_ = -1;
  }
  else if ((keyword == ARGUMENT_KEYWORD) || (c = stmt, stmt == LY_STMT_ARGUMENT)) {
    c = 1;
    str._0_4_ = -1;
  }
  decrement = keyword;
  _keyword_local = ext;
  plVar1 = (long *)lys_ext_complex_get_substmt(c,ext,&local_40);
  if (((plVar1 == (long *)0x0) || (local_40->cardinality < LY_STMT_CARD_SOME)) || (*plVar1 == 0)) {
    ext_local._4_4_ = 0;
  }
  else {
    str._4_4_ = 0;
    while (*(long *)(*plVar1 + (long)str._4_4_ * 8) != 0) {
      str._4_4_ = str._4_4_ + 1;
    }
    ext_local._4_4_ = str._4_4_ + (int)str;
  }
  return ext_local._4_4_;
}

Assistant:

static int
yang_fill_ext_substm_index(struct lys_ext_instance_complex *ext, LY_STMT stmt, enum yytokentype keyword)
{
    int c = 0, decrement = 0;
    const char **str, ***p = NULL;
    struct lyext_substmt *info;


    if (keyword == BELONGS_TO_KEYWORD || stmt == LY_STMT_BELONGSTO) {
        stmt = LY_STMT_BELONGSTO;
        decrement = -1;
    } else if (keyword == ARGUMENT_KEYWORD || stmt == LY_STMT_ARGUMENT) {
        stmt = LY_STMT_ARGUMENT;
        decrement = -1;
    }

    str = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!str || info->cardinality < LY_STMT_CARD_SOME || !((const char ***)str)[0]) {
        return 0;
    } else {
        p = (const char ***)str;
        /* get the index in the array */
        for (c = 0; p[0][c]; c++);
        return c + decrement;
    }
}